

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie_tree.cpp
# Opt level: O2

void __thiscall la::trie_tree::insert(trie_tree *this,string *key)

{
  trie_tree tVar1;
  pointer pcVar2;
  size_t sVar3;
  trie_node *this_00;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar4 = 0;
  while (tVar1._root_node = this->_root_node, uVar4 < key->_M_string_length) {
    sVar3 = trie_node::convertIndex((key->_M_dataplus)._M_p + uVar4);
    this = (trie_tree *)(((tVar1._root_node)->_children)._M_elems + sVar3);
    if (*(trie_node **)this == (trie_node *)0x0) {
      this_00 = (trie_node *)operator_new(0x168);
      pcVar2 = (key->_M_dataplus)._M_p;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_50,key,0,uVar4 + 1);
      trie_node::trie_node(this_00,pcVar2 + uVar4,&local_50);
      *this = (trie_tree)this_00;
      std::__cxx11::string::~string((string *)&local_50);
      uVar4 = uVar4 + 1;
    }
    else {
      uVar4 = uVar4 + 1;
    }
  }
  (tVar1._root_node)->_is_end_word = true;
  return;
}

Assistant:

void trie_tree::insert(std::string &&key)
    {
        auto cur_node{_root_node};
        for (decltype(key.size()) i{0}; i < key.size(); ++i)
        {
            const auto ci{trie_node::convertIndex(key[i])};
            if (cur_node->_children[ci] == nullptr)
                cur_node->_children[ci] = new trie_node{key[i], key.substr(0, i + 1)};
            cur_node = cur_node->_children[ci];
        }
        cur_node->_is_end_word = true;
    }